

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardSubsumptionDemodulation.cpp
# Opt level: O1

void __thiscall
Inferences::ForwardSubsumptionDemodulation::attach
          (ForwardSubsumptionDemodulation *this,SaturationAlgorithm *salg)

{
  IndexManager *pIVar1;
  LiteralIndex<Indexing::LiteralClause> *pLVar2;
  
  (this->super_ForwardSimplificationEngine).super_InferenceEngine._salg = salg;
  pIVar1 = (salg->_imgr)._obj;
  (this->_index)._indexManager = pIVar1;
  (this->_index)._type = FSD_SUBST_TREE;
  pLVar2 = (LiteralIndex<Indexing::LiteralClause> *)
           Indexing::IndexManager::request(pIVar1,FSD_SUBST_TREE);
  (this->_index)._index = pLVar2;
  this->_preorderedOnly = false;
  this->_allowIncompleteness = false;
  if (this->_doSubsumption == true) {
    pIVar1 = (salg->_imgr)._obj;
    (this->_unitIndex)._indexManager = pIVar1;
    (this->_unitIndex)._type = FW_SUBSUMPTION_UNIT_CLAUSE_SUBST_TREE;
    pLVar2 = (LiteralIndex<Indexing::LiteralClause> *)
             Indexing::IndexManager::request(pIVar1,FW_SUBSUMPTION_UNIT_CLAUSE_SUBST_TREE);
    (this->_unitIndex)._index = pLVar2;
  }
  return;
}

Assistant:

void ForwardSubsumptionDemodulation::attach(SaturationAlgorithm* salg)
{
  ForwardSimplificationEngine::attach(salg);

  _index.request(salg->getIndexManager(), FSD_SUBST_TREE);

  _preorderedOnly = false;
  _allowIncompleteness = false;

  if (_doSubsumption) {
    _unitIndex.request(salg->getIndexManager(), FW_SUBSUMPTION_UNIT_CLAUSE_SUBST_TREE);
  }
}